

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_RgbToBgr(RgbToBgrForm1 RgbToBgr)

{
  uint8_t value;
  bool bVar1;
  uint32_t uVar2;
  reference __a;
  reference __b;
  code *in_RDI;
  Image output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image input;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  undefined2 uVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  undefined1 isAnyValue;
  uint32_t in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff40;
  byte bVar5;
  undefined4 in_stack_ffffffffffffff44;
  undefined1 local_a8 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff84;
  uint32_t in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff8c;
  Image *in_stack_ffffffffffffff90;
  ImageTemplate<unsigned_char> local_30;
  code *local_8;
  
  uVar2 = (uint32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  uVar3 = (undefined2)((ulong)in_stack_ffffffffffffff30 >> 0x30);
  local_8 = in_RDI;
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c
             ,in_stack_ffffffffffffff38,(uint8_t)((ushort)uVar3 >> 8),(uint8_t)uVar3);
  Test_Helper::uniformRGBImage
            (value,(Image *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e063f);
  Unit_Test::intensityArray(uVar2);
  PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_30);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_30);
  Unit_Test::fillImage
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  (*local_8)(local_a8,&local_30);
  uVar4 = 0;
  this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffff80;
  __a = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,0);
  __b = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,2);
  isAnyValue = (undefined1)((ulong)this >> 0x38);
  std::swap<unsigned_char>(__a,__b);
  bVar1 = Unit_Test::verifyImage
                    ((Image *)CONCAT44(uVar2,in_stack_ffffffffffffff40),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(uVar4,in_stack_ffffffffffffff38),(bool)isAnyValue);
  uVar4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff40);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e0709);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(uVar2,uVar4));
  bVar5 = (byte)((uint)uVar4 >> 0x18);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e0720);
  return (bool)(bVar5 & 1);
}

Assistant:

bool form1_RgbToBgr(RgbToBgrForm1 RgbToBgr)
    {
        PenguinV_Image::Image input = uniformRGBImage( intensityValue() );
        std::vector< uint8_t > intensity = intensityArray( 3 );

        fillImage( input, 0, 0, input.width(), input.height(), intensity );

        const PenguinV_Image::Image output = RgbToBgr( input );

        std::swap( intensity[0], intensity[2] );

        return verifyImage( output, intensity, false );
    }